

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes.cc
# Opt level: O0

void __thiscall
cnn::InnerProduct3D_1D::backward_impl
          (InnerProduct3D_1D *this,
          vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_> *xs,Tensor *fx,
          Tensor *dEdf,uint i,Tensor *dEdxi)

{
  vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_> *in_RSI;
  int in_R8D;
  array<DimPair,_2> dims;
  TensorMap<Eigen::Tensor<float,_3,_0,_long>,_0,_Eigen::MakePointer> A;
  TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer> b;
  TensorMap<Eigen::Tensor<float,_2,_0,_long>,_0,_Eigen::MakePointer> tdEdf;
  Tensor *this_00;
  undefined1 in_stack_fffffffffffffea0 [16];
  Tensor *in_stack_fffffffffffffeb0;
  TensorMap<Eigen::Tensor<float,_2,_0,_long>,_0,_Eigen::MakePointer> *in_stack_fffffffffffffec8;
  TensorBase<Eigen::TensorMap<Eigen::Tensor<float,_2,_0,_long>,_0,_Eigen::MakePointer>,_1>
  *in_stack_fffffffffffffed0;
  TensorContractionOp<const_std::array<Eigen::IndexPair<long>,_0UL>,_const_Eigen::TensorMap<Eigen::Tensor<float,_2,_0,_long>,_0,_Eigen::MakePointer>,_const_Eigen::TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer>,_const_Eigen::NoOpOutputKernel>
  *in_stack_fffffffffffffee8;
  TensorBase<Eigen::TensorMap<Eigen::Tensor<float,_3,_0,_long>,_0,_Eigen::MakePointer>,_1>
  *in_stack_fffffffffffffef0;
  TensorContractionOp<const_std::array<Eigen::IndexPair<long>,_2UL>,_const_Eigen::TensorMap<Eigen::Tensor<float,_2,_0,_long>,_0,_Eigen::MakePointer>,_const_Eigen::TensorMap<Eigen::Tensor<float,_3,_0,_long>,_0,_Eigen::MakePointer>,_const_Eigen::NoOpOutputKernel>
  *in_stack_ffffffffffffff08;
  TensorBase<Eigen::TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer>,_1> *this_01;
  
  Tensor::t<2>(in_stack_fffffffffffffeb0);
  if (in_R8D == 0) {
    std::vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_>::operator[](in_RSI,1);
    Tensor::t<1>(in_stack_fffffffffffffea0._0_8_);
    Eigen::TensorBase<Eigen::TensorMap<Eigen::Tensor<float,2,0,long>,0,Eigen::MakePointer>,0>::
    contract<Eigen::TensorMap<Eigen::Tensor<float,1,0,long>,0,Eigen::MakePointer>,std::array<Eigen::IndexPair<long>,0ul>>
              ((TensorBase<Eigen::TensorMap<Eigen::Tensor<float,_2,_0,_long>,_0,_Eigen::MakePointer>,_0>
                *)in_stack_fffffffffffffeb0,in_stack_fffffffffffffea0._8_8_,
               in_stack_fffffffffffffea0._0_8_);
    Tensor::t<3>(in_stack_fffffffffffffeb0);
    Eigen::TensorBase<Eigen::TensorMap<Eigen::Tensor<float,3,0,long>,0,Eigen::MakePointer>,1>::
    operator+=(in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
  }
  else if (in_R8D == 1) {
    std::vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_>::operator[](in_RSI,0);
    Tensor::t<3>(in_stack_fffffffffffffeb0);
    this_01 = (TensorBase<Eigen::TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer>,_1>
               *)0x0;
    this_00 = in_stack_fffffffffffffea0._0_8_;
    Eigen::TensorBase<Eigen::TensorMap<Eigen::Tensor<float,2,0,long>,0,Eigen::MakePointer>,0>::
    contract<Eigen::TensorMap<Eigen::Tensor<float,3,0,long>,0,Eigen::MakePointer>,std::array<Eigen::IndexPair<long>,2ul>>
              ((TensorBase<Eigen::TensorMap<Eigen::Tensor<float,_2,_0,_long>,_0,_Eigen::MakePointer>,_0>
                *)in_stack_fffffffffffffeb0,in_stack_fffffffffffffea0._8_8_,
               (array<Eigen::IndexPair<long>,_2UL> *)this_00);
    Tensor::t<1>(this_00);
    Eigen::TensorBase<Eigen::TensorMap<Eigen::Tensor<float,1,0,long>,0,Eigen::MakePointer>,1>::
    operator+=(this_01,in_stack_ffffffffffffff08);
  }
  else {
    if (in_R8D != 2) {
      std::operator<<((ostream *)&std::cerr,"shouldn\'t happen\n");
      abort();
    }
    Tensor::t<2>(in_stack_fffffffffffffeb0);
    Eigen::TensorBase<Eigen::TensorMap<Eigen::Tensor<float,2,0,long>,0,Eigen::MakePointer>,1>::
    operator+=(in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
  }
  return;
}

Assistant:

void InnerProduct3D_1D::backward_impl(const vector<const Tensor*>& xs,
                     const Tensor& fx,
                     const Tensor& dEdf,
                     unsigned i,
                     Tensor& dEdxi) const {
  auto tdEdf = dEdf.t<2>();  // 2 tensor
  typedef Eigen::Tensor<float, 1>::DimensionPair DimPair;
  if (i == 0) { // 3 tensor
    // tensor product
    auto b = xs[1]->t<1>();
    dEdxi.t<3>() += tdEdf.contract(b, Eigen::array<DimPair, 0>{{}});
  } else if (i == 1) {
    auto A = xs[0]->t<3>();  // A is 3 tensor
    Eigen::array<DimPair, 2> dims({{DimPair(0, 0), DimPair(1, 1)}});
    dEdxi.t<1>() += tdEdf.contract(A, dims);
  } else if (i == 2) {
    dEdxi.t<2>() += tdEdf;
  } else {
    cerr << "shouldn't happen\n"; abort();
  }
}